

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O1

void CheckTable(TidyDocImpl *doc,Node *node)

{
  Attribute *pAVar1;
  Dict *pDVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  Bool BVar6;
  uint uVar7;
  int iVar8;
  ctmbstr ptVar9;
  Node *pNVar10;
  ctmbstr cp;
  char *pcVar11;
  Node *pNVar12;
  tmbchar *ptVar13;
  uint uVar14;
  AttVal *pAVar15;
  
  bVar5 = false;
  if ((doc->access).PRIORITYCHK == 3) {
    bVar5 = false;
    for (pAVar15 = node->attributes; pAVar15 != (AttVal *)0x0; pAVar15 = pAVar15->next) {
      if ((pAVar15->dict != (Attribute *)0x0) && (pAVar15->dict->id == TidyAttr_SUMMARY)) {
        pcVar11 = pAVar15->value;
        if (pcVar11 != (char *)0x0) {
          do {
            if (*pcVar11 == '\0') goto LAB_00152ca0;
            BVar6 = prvTidyIsWhite((int)*pcVar11);
            pcVar11 = pcVar11 + 1;
          } while (BVar6 != no);
          bVar5 = true;
          if ((((pAVar15->value != (ctmbstr)0x0) &&
               (ptVar9 = prvTidytmbsubstr(pAVar15->value,"summary"), ptVar9 != (ctmbstr)0x0)) &&
              (pAVar15->value != (ctmbstr)0x0)) &&
             (ptVar9 = prvTidytmbsubstr(pAVar15->value,"table"), ptVar9 != (ctmbstr)0x0)) {
            prvTidyReportAccessError(doc,node,0x2cc);
          }
        }
LAB_00152ca0:
        uVar14 = 0x2ca;
        if ((pAVar15->value == (ctmbstr)0x0) ||
           (uVar7 = prvTidytmbstrlen(pAVar15->value), uVar7 == 0)) {
LAB_00152cea:
          prvTidyReportAccessError(doc,node,uVar14);
          bVar5 = true;
        }
        else {
          pcVar11 = pAVar15->value;
          if (pcVar11 == (char *)0x0) {
LAB_00152cd7:
            uVar7 = prvTidytmbstrlen(pAVar15->value);
            uVar14 = 0x2cb;
            if (uVar7 != 0) goto LAB_00152cea;
          }
          else {
            do {
              if (*pcVar11 == '\0') goto LAB_00152cd7;
              BVar6 = prvTidyIsWhite((int)*pcVar11);
              pcVar11 = pcVar11 + 1;
            } while (BVar6 != no);
          }
        }
      }
    }
    if (node->content == (Node *)0x0) {
      uVar14 = 0x2c2;
      goto LAB_0015309f;
    }
  }
  if ((0xfffffffc < (doc->access).PRIORITYCHK - 4U) &&
     (pNVar10 = node->content, pNVar10 != (Node *)0x0)) {
    bVar4 = true;
    bVar3 = true;
    do {
      if ((pNVar10->tag != (Dict *)0x0) && (pNVar10->tag->id == TidyTag_TR)) {
        for (pNVar12 = pNVar10->content; pNVar12 != (Node *)0x0; pNVar12 = pNVar12->next) {
          if ((pNVar12->tag != (Dict *)0x0) && (pNVar12->tag->id == TidyTag_TH)) {
            for (pAVar15 = pNVar12->attributes; pAVar15 != (AttVal *)0x0; pAVar15 = pAVar15->next) {
              pAVar1 = pAVar15->dict;
              if (((pAVar1 != (Attribute *)0x0) && (pAVar1->id == TidyAttr_COLSPAN)) &&
                 (iVar8 = atoi(pAVar15->value), 1 < iVar8)) {
                bVar4 = false;
              }
              if (((pAVar1 != (Attribute *)0x0) && (pAVar1->id == TidyAttr_ROWSPAN)) &&
                 (iVar8 = atoi(pAVar15->value), 1 < iVar8)) {
                bVar3 = false;
              }
            }
          }
        }
      }
      pNVar10 = pNVar10->next;
    } while (pNVar10 != (Node *)0x0);
    if (!bVar3) {
      prvTidyReportAccessError(doc,node,0x2c6);
      prvTidyDialogue(doc,0x20a);
    }
    if (!bVar4) {
      prvTidyReportAccessError(doc,node,0x2c5);
      prvTidyDialogue(doc,0x20a);
    }
  }
  if (((doc->access).PRIORITYCHK & 0xfffffffeU) == 2) {
    pNVar10 = node->content;
    if (((pNVar10 != (Node *)0x0) && (pNVar10->tag != (Dict *)0x0)) &&
       (pNVar10->tag->id == TidyTag_CAPTION)) {
      if ((pNVar10->content == (Node *)0x0) || (pNVar10->content->tag != (Dict *)0x0)) {
        ptVar13 = (tmbchar *)0x0;
      }
      else {
        ptVar13 = (doc->access).textNode;
        memset(&(doc->access).counter,0,0x84);
        getTextNode(doc,pNVar10->content);
      }
      if (ptVar13 != (tmbchar *)0x0) {
        do {
          if (*ptVar13 == '\0') goto LAB_00152ec1;
          BVar6 = prvTidyIsWhite((int)*ptVar13);
          ptVar13 = ptVar13 + 1;
        } while (BVar6 != no);
        goto LAB_00152ed1;
      }
    }
LAB_00152ec1:
    prvTidyReportAccessError(doc,node,0x2cd);
  }
LAB_00152ed1:
  pNVar10 = node->content;
  if (((pNVar10 != (Node *)0x0) && (pDVar2 = pNVar10->tag, pDVar2 != (Dict *)0x0)) &&
     (((pDVar2->id == TidyTag_CAPTION &&
       (((pNVar12 = pNVar10->next, pNVar12 != (Node *)0x0 && (pNVar12->tag != (Dict *)0x0)) &&
        (pNVar12->tag->id == TidyTag_TR)))) ||
      ((pDVar2 != (Dict *)0x0 && (pNVar12 = pNVar10, pDVar2->id == TidyTag_TR)))))) {
    CheckColumns(doc,pNVar12);
  }
  if ((((doc->access).HasValidColumnHeaders == no) &&
      (pNVar10 = node->content, pNVar10 != (Node *)0x0)) &&
     ((pDVar2 = pNVar10->tag, pDVar2 != (Dict *)0x0 &&
      (((((pDVar2->id == TidyTag_CAPTION && (pNVar12 = pNVar10->next, pNVar12 != (Node *)0x0)) &&
         (pNVar12->tag != (Dict *)0x0)) && (pNVar12->tag->id == TidyTag_TR)) ||
       ((pDVar2 != (Dict *)0x0 && (pNVar12 = pNVar10, pDVar2->id == TidyTag_TR)))))))) {
    CheckRows(doc,pNVar12);
  }
  if (((doc->access).PRIORITYCHK == 3) && (!bVar5)) {
    prvTidyReportAccessError(doc,node,0x2c9);
  }
  if (((doc->access).PRIORITYCHK & 0xfffffffeU) == 2) {
    pNVar10 = node->content;
    if (pNVar10 != (Node *)0x0) {
      iVar8 = 0;
      do {
        if (pNVar10->tag != (Dict *)0x0) {
          iVar8 = iVar8 + (uint)(pNVar10->tag->id == TidyTag_TR);
        }
        pNVar10 = pNVar10->next;
      } while (pNVar10 != (Node *)0x0);
      if (iVar8 == 1) {
        prvTidyReportAccessError(doc,node,0x2c7);
      }
    }
    if ((doc->access).HasTH != no) {
      prvTidyReportAccessError(doc,node,0x2c8);
    }
  }
  if ((0xfffffffc < (doc->access).PRIORITYCHK - 4U) && ((doc->access).CheckedHeaders == 2)) {
    if (((doc->access).HasValidRowHeaders == no) &&
       ((((doc->access).HasValidColumnHeaders == no && ((doc->access).HasInvalidRowHeader == no)) &&
        ((doc->access).HasInvalidColumnHeader == no)))) {
      prvTidyReportAccessError(doc,node,0x2c2);
    }
    if (((doc->access).HasValidRowHeaders == no) && ((doc->access).HasInvalidRowHeader != no)) {
      prvTidyReportAccessError(doc,node,0x2c4);
    }
    if (((doc->access).HasValidColumnHeaders == no) &&
       (uVar14 = 0x2c3, (doc->access).HasInvalidColumnHeader != no)) {
LAB_0015309f:
      prvTidyReportAccessError(doc,node,uVar14);
      return;
    }
  }
  return;
}

Assistant:

static void CheckTable( TidyDocImpl* doc, Node* node )
{
    Node* TNode;
    Node* temp;

    tmbstr word = NULL;

    int numTR = 0;

    Bool HasSummary = no;
    Bool HasCaption = no;

    if (Level3_Enabled( doc ))
    {
        AttVal* av;
        /* Table must have a 'SUMMARY' describing the purpose of the table */
        for (av = node->attributes; av != NULL; av = av->next)
        {
            if ( attrIsSUMMARY(av) )
            {
                if ( hasValue(av) )
                {
                    HasSummary = yes;

                    if (AttrContains(av, "summary") && 
                        AttrContains(av, "table"))
                    {
                        TY_(ReportAccessError)( doc, node, TABLE_SUMMARY_INVALID_PLACEHOLDER );
                    }
                }

                if ( av->value == NULL || TY_(tmbstrlen)(av->value) == 0 )
                {
                    HasSummary = yes;
                    TY_(ReportAccessError)( doc, node, TABLE_SUMMARY_INVALID_NULL );
                }
                else if ( IsWhitespace(av->value) && TY_(tmbstrlen)(av->value) > 0 )
                {
                    HasSummary = yes;
                    TY_(ReportAccessError)( doc, node, TABLE_SUMMARY_INVALID_SPACES );
                }
            }
        }

        /* TABLE must have content. */
        if (node->content == NULL)
        {
            TY_(ReportAccessError)( doc, node, DATA_TABLE_MISSING_HEADERS);
        
            return;
        }
    }

    if (Level1_Enabled( doc ))
    {
        /* Checks for multiple headers */
        CheckMultiHeaders( doc, node );
    }
    
    if (Level2_Enabled( doc ))
    {
        /* Table must have a CAPTION describing the purpose of the table */
        if ( nodeIsCAPTION(node->content) )
        {
            TNode = node->content;

            if (TNode->content && TNode->content->tag == NULL)
            {
                word = getTextNodeClear( doc, TNode);
            }

            if ( !IsWhitespace(word) )
            {
                HasCaption = yes;
            }
        }

        if (HasCaption == no)
        {
            TY_(ReportAccessError)( doc, node, TABLE_MISSING_CAPTION);
        }
    }

    
    if (node->content != NULL)
    {
        if ( nodeIsCAPTION(node->content) && nodeIsTR(node->content->next) )
        {
            CheckColumns( doc, node->content->next );
        }
        else if ( nodeIsTR(node->content) )
        {
            CheckColumns( doc, node->content );
        }
    }
    
    if ( ! doc->access.HasValidColumnHeaders )
    {
        if (node->content != NULL)
        {
            if ( nodeIsCAPTION(node->content) && nodeIsTR(node->content->next) )
            {
                CheckRows( doc, node->content->next);
            }
            else if ( nodeIsTR(node->content) )
            {
                CheckRows( doc, node->content);
            }
        }
    }
    
    
    if (Level3_Enabled( doc ))
    {
        /* Suppress warning for missing 'SUMMARY for HTML 2.0 and HTML 3.2 */
        if (HasSummary == no)
        {
            TY_(ReportAccessError)( doc, node, TABLE_MISSING_SUMMARY);
        }
    }

    if (Level2_Enabled( doc ))
    {
        if (node->content != NULL)
        {
            temp = node->content;

            while (temp != NULL)
            {
                if ( nodeIsTR(temp) )
                {
                    numTR++;
                }

                temp = temp->next;
            }

            if (numTR == 1)
            {
                TY_(ReportAccessError)( doc, node, LAYOUT_TABLES_LINEARIZE_PROPERLY);
            }
        }
    
        if ( doc->access.HasTH )
        {
            TY_(ReportAccessError)( doc, node, LAYOUT_TABLE_INVALID_MARKUP);
        }
    }

    if (Level1_Enabled( doc ))
    {
        if ( doc->access.CheckedHeaders == 2 )
        {
            if ( !doc->access.HasValidRowHeaders &&
                 !doc->access.HasValidColumnHeaders &&
                 !doc->access.HasInvalidRowHeader &&
                 !doc->access.HasInvalidColumnHeader  )
            {
                TY_(ReportAccessError)( doc, node, DATA_TABLE_MISSING_HEADERS);
            }

            if ( !doc->access.HasValidRowHeaders && 
                 doc->access.HasInvalidRowHeader )
            {
                TY_(ReportAccessError)( doc, node, DATA_TABLE_MISSING_HEADERS_ROW);
            }

            if ( !doc->access.HasValidColumnHeaders &&
                 doc->access.HasInvalidColumnHeader )
            {
                TY_(ReportAccessError)( doc, node, DATA_TABLE_MISSING_HEADERS_COLUMN);
            }
        }
    }
}